

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

bool qt_normalizePathSegments(QString *path,PathNormalizations flags)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  ulong alloc;
  Data *pDVar3;
  char16_t *pcVar4;
  QArrayData *data;
  char16_t *pcVar5;
  bool bVar6;
  bool bVar7;
  char16_t *__length;
  char16_t *pcVar8;
  char16_t *pcVar9;
  char16_t cVar10;
  long lVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  
  pcVar9 = (path->d).ptr;
  alloc = (path->d).size;
  uVar12 = 0;
  if (alloc != 0) {
    uVar12 = (ulong)(*pcVar9 == L'/');
  }
  uVar15 = uVar12;
  if (uVar12 < alloc) {
    bVar7 = true;
    uVar14 = uVar12;
    do {
      if ((bVar7) && (pcVar9[uVar14] == L'.')) {
        uVar15 = uVar14;
        if (alloc - 1 == uVar14) break;
        cVar10 = pcVar9[uVar14 + 1];
        if (cVar10 == L'.') {
          if (alloc - 2 == uVar14) break;
          cVar10 = pcVar9[uVar14 + 2];
        }
        if (cVar10 == L'/') break;
      }
      if (((((~bVar7 | (byte)((uint)flags.
                                    super_QFlagsStorageHelper<QDirPrivate::PathNormalization,_4>.
                                    super_QFlagsStorage<QDirPrivate::PathNormalization>.i >> 1) &
                       0x7f) & 1) == 0) && (uVar14 != 0)) && (pcVar9[uVar14] == L'/')) {
        uVar15 = uVar14 - 1;
        break;
      }
      bVar7 = pcVar9[uVar14] == L'/';
      uVar14 = uVar14 + 1;
      uVar15 = alloc;
    } while (alloc != uVar14);
  }
  bVar7 = true;
  if (uVar15 != alloc) {
    pDVar3 = (path->d).d;
    if ((pDVar3 == (Data *)0x0) ||
       (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QString::reallocData(path,alloc,KeepSize);
    }
    pcVar4 = (path->d).ptr;
    pcVar9 = pcVar4 + uVar12;
    pcVar2 = pcVar4 + (path->d).size;
    __length = pcVar4 + uVar15;
    bVar13 = 1;
    pcVar8 = __length;
    do {
      cVar10 = *__length;
      if (cVar10 == L'/') {
        do {
          *pcVar8 = cVar10;
          pcVar8 = pcVar8 + 1;
          do {
            __length = __length + 1;
            if ((pcVar2 <= __length) || (*__length != L'/')) goto LAB_0010ccfc;
            cVar10 = L'/';
          } while (((uint)flags.super_QFlagsStorageHelper<QDirPrivate::PathNormalization,_4>.
                          super_QFlagsStorage<QDirPrivate::PathNormalization>.i & 2) == 0);
        } while( true );
      }
LAB_0010ccfc:
      bVar7 = true;
      if (*__length == L'.') {
        if ((__length + 1 == pcVar2) || (cVar10 = __length[1], cVar10 == L'/')) {
          bVar7 = false;
          goto LAB_0010cd39;
        }
        if ((cVar10 != L'.') || ((__length + 2 != pcVar2 && (__length[2] != L'/'))))
        goto LAB_0010cd39;
        bVar6 = true;
        bVar7 = false;
      }
      else {
LAB_0010cd39:
        bVar6 = false;
      }
      if (bVar7) {
        for (; (__length < pcVar2 && (*__length != L'/')); __length = __length + 1) {
          *pcVar8 = *__length;
          pcVar8 = pcVar8 + 1;
        }
      }
      else {
        lVar11 = 2;
        if (bVar6) {
          if (pcVar8 == pcVar9) {
            if (((uint)flags.super_QFlagsStorageHelper<QDirPrivate::PathNormalization,_4>.
                       super_QFlagsStorage<QDirPrivate::PathNormalization>.i & 2) == 0) {
              pcVar8[0] = L'.';
              pcVar8[1] = L'.';
              if (__length + 2 == pcVar2) {
                pcVar8 = pcVar8 + 2;
              }
              else {
                pcVar8[2] = L'/';
                pcVar8 = pcVar8 + 3;
                __length = __length + 1;
              }
              __length = __length + 2;
              bVar13 = 0;
              pcVar9 = pcVar8;
              goto LAB_0010cdb9;
            }
            bVar13 = 0;
          }
          pcVar5 = pcVar8 + (pcVar8 <= pcVar9);
          do {
            pcVar8 = pcVar5 + -1;
            lVar11 = 4;
            if (pcVar8 <= pcVar9) break;
            pcVar1 = pcVar5 + -2;
            pcVar5 = pcVar8;
          } while (*pcVar1 != L'/');
        }
        __length = (char16_t *)((long)__length + lVar11);
        if (((__length != pcVar2) && (pcVar9 < pcVar8)) && (pcVar8[-1] == L'/')) {
          pcVar8 = pcVar8 + -1;
        }
        if (pcVar8 == pcVar9) {
          if (__length != pcVar2) {
            __length = __length + (*__length == L'/');
          }
          for (; ((uVar12 == 0 && (__length != pcVar2)) && (*__length == L'/'));
              __length = __length + 1) {
          }
        }
      }
LAB_0010cdb9:
    } while (__length < pcVar2);
    QString::truncate(path,(char *)((long)pcVar8 - (long)pcVar4 >> 1),(__off_t)__length);
    if ((((uint)flags.super_QFlagsStorageHelper<QDirPrivate::PathNormalization,_4>.
                super_QFlagsStorage<QDirPrivate::PathNormalization>.i & 2) == 0) &&
       ((path->d).size == 0)) {
      data = &((path->d).d)->super_QArrayData;
      (path->d).d = (Data *)0x0;
      (path->d).ptr = L".";
      (path->d).size = 1;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
    }
    bVar7 = (bool)(uVar12 == 0 | bVar13);
  }
  return bVar7;
}

Assistant:

bool qt_normalizePathSegments(QString *path, QDirPrivate::PathNormalizations flags)
{
    const bool isRemote = flags.testAnyFlag(QDirPrivate::RemotePath);
    const qsizetype prefixLength = rootLength(*path, flags);

    // RFC 3986 says: "The input buffer is initialized with the now-appended
    // path components and the output buffer is initialized to the empty
    // string."
    const QChar *in = path->constBegin();

    // Scan the input for a "." or ".." segment. If there isn't any, we may not
    // need to modify this path at all. Also scan for "//" segments, which
    // will be normalized if the path is local.
    qsizetype i = prefixLength;
    qsizetype n = path->size();
    for (bool lastWasSlash = true; i < n; ++i) {
        if (lastWasSlash && in[i] == u'.') {
            if (i + 1 == n || in[i + 1] == u'/')
                break;
            if (in[i + 1] == u'.' && (i + 2 == n || in[i + 2] == u'/'))
                break;
        }
        if (!isRemote && lastWasSlash && in[i] == u'/' && i > 0) {
            // backtrack one, so the algorithm below gobbles up the remaining
            // slashes
            --i;
            break;
        }
        lastWasSlash = in[i] == u'/';
    }
    if (i == n)
        return true;

    QChar *out = path->data();  // detaches
    const QChar *start = out + prefixLength;
    const QChar *end = out + path->size();
    out += i;
    in = out;

    // We implement a modified algorithm compared to RFC 3986, for efficiency.
    bool ok = true;
    do {
#if 0   // to see in the debugger
        QString output = QStringView(path->constBegin(), out).toString();
        QStringView input(in, end);
#endif

        // First, copy the preceding slashes, so we can look at the segment's
        // content. If the path is part of a URL, we copy all slashes, otherwise
        // just one.
        if (in[0] == u'/') {
            *out++ = *in++;
            while (in < end && in[0] == u'/') {
                if (isRemote)
                    *out++ = *in++;
                else
                    ++in; // Skip multiple slashes for local URLs

                // Note: we may exit this loop with in == end, in which case we
                // *shouldn't* dereference *in. But since we are pointing to a
                // detached, non-empty QString, we know there's a u'\0' at the
                // end, so dereferencing is safe.
            }
        }

        // Is this path segment either "." or ".."?
        enum { Nothing, Dot, DotDot } type = Nothing;
        if (in[0] == u'.') {
            if (in + 1 == end || in[1] == u'/')
                type = Dot;
            else if (in[1] == u'.' && (in + 2 == end || in[2] == u'/'))
                type = DotDot;
        }
        if (type == Nothing) {
            // If it is neither, then we copy this segment.
            while (in < end && in[0] != u'/')
                *out++ = *in++;
            continue;
        }

        // Otherwise, we skip it and remove preceding slashes (if
        // any, exactly one if part of a URL, all otherwise) from the
        // output. If it is "..", we remove the segment before that and
        // preceding slashes too in a similar fashion, if they are there.
        if (type == DotDot) {
            if (Q_UNLIKELY(out == start)) {
                // we can't go further up from here, so we "re-root"
                // without cleaning this segment
                ok = false;
                if (!isRemote) {
                    *out++ = u'.';
                    *out++ = u'.';
                    if (in + 2 != end) {
                        Q_ASSERT(in[2] == u'/');
                        *out++ = u'/';
                        ++in;
                    }
                    start = out;
                    in += 2;
                    continue;
                }
            }

            if (out > start)
                --out; // backtrack the first dot
            // backtrack the previous path segment
            while (out > start && out[-1] != u'/')
                --out;
            in += 2;    // the two dots
        } else {
            ++in;       // the one dot
        }

        // Not at 'end' yet, prepare for the next loop iteration by backtracking one slash.
        // E.g.: /a/b/../c    >>> /a/b/../c
        //          ^out            ^out
        // the next iteration will copy '/c' to the output buffer >>> /a/c
        if (in != end && out > start && out[-1] == u'/')
            --out;
        if (out == start) {
            // We've reached the root. Make sure we don't turn a relative path
            // to absolute or, in the case of local paths that are already
            // absolute, into UNC.
            // Note: this will turn ".//a" into "a" even for URLs!
            if (in != end && in[0] == u'/')
                ++in;
            while (prefixLength == 0 && in != end && in[0] == u'/')
                ++in;
        }
    } while (in < end);

    path->truncate(out - path->constBegin());
    if (!isRemote && path->isEmpty())
        *path = u"."_s;

    // we return false only if the path was absolute
    return ok || prefixLength == 0;
}